

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O3

int ffcvtn(int inputType,void *input,char *undef,long ntodo,int outputType,void *nulval,void *output
          ,int *anynull,int *status)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  
  if (outputType < 0x29) {
    if (outputType < 0x15) {
      if (outputType == 0xb) {
        if (inputType < 0x29) {
          if ((inputType == 0xb) || (inputType == 0xe)) {
            if (ntodo < 1) goto LAB_0011dfd5;
            lVar3 = 0;
            do {
              *(undefined1 *)((long)output + lVar3) = *(undefined1 *)((long)input + lVar3);
              lVar3 = lVar3 + 1;
            } while (ntodo != lVar3);
          }
          else if (inputType == 0x15) {
            fffi2i1((short *)input,ntodo,1.0,0.0,0,0,'\0',(char *)0x0,(int *)0x0,(uchar *)output,
                    status);
          }
          else {
LAB_0011dc40:
            *status = 0x19a;
          }
        }
        else if (inputType == 0x52) {
          fffr8i1((double *)input,ntodo,1.0,0.0,0,'\0',(char *)0x0,(int *)0x0,(uchar *)output,status
                 );
        }
        else {
          if (inputType != 0x2a) {
            if (inputType == 0x29) {
              if (0 < ntodo) {
                lVar3 = 0;
                do {
                  if (undef[lVar3] == '\0') {
                    uVar1 = *(ulong *)((long)input + lVar3 * 8);
                    if ((long)uVar1 < 0) {
                      *status = -0xb;
                      *(undefined1 *)((long)output + lVar3) = 0;
                    }
                    else if (uVar1 < 0x100) {
                      *(char *)((long)output + lVar3) = (char)uVar1;
                    }
                    else {
                      *status = -0xb;
                      *(undefined1 *)((long)output + lVar3) = 0xff;
                    }
                  }
                  else {
                    *(undefined1 *)((long)output + lVar3) = *nulval;
                    *anynull = 1;
                  }
                  lVar3 = lVar3 + 1;
                } while (ntodo != lVar3);
              }
              goto LAB_0011dfd5;
            }
            goto LAB_0011dc40;
          }
          fffr4i1((float *)input,ntodo,1.0,0.0,0,'\0',(char *)0x0,(int *)0x0,(uchar *)output,status)
          ;
        }
        if (0 < ntodo) {
          lVar3 = 0;
          do {
            if (undef[lVar3] != '\0') {
              *(undefined1 *)((long)output + lVar3) = *nulval;
              *anynull = 1;
            }
            lVar3 = lVar3 + 1;
          } while (ntodo != lVar3);
        }
        goto LAB_0011dfd5;
      }
      if (outputType == 0xe) {
        if (inputType < 0x29) {
          if ((inputType == 0xb) || (inputType == 0xe)) {
            if (ntodo < 1) goto LAB_0011dfd5;
            lVar3 = 0;
            do {
              *(bool *)((long)output + lVar3) = *(char *)((long)input + lVar3) != '\0';
              lVar3 = lVar3 + 1;
            } while (ntodo != lVar3);
          }
          else if (inputType == 0x15) {
            if (ntodo < 1) goto LAB_0011dfd5;
            lVar3 = 0;
            do {
              *(bool *)((long)output + lVar3) = *(short *)((long)input + lVar3 * 2) != 0;
              lVar3 = lVar3 + 1;
            } while (ntodo != lVar3);
          }
          else {
LAB_0011dd0d:
            *status = 0x19a;
          }
        }
        else if (inputType == 0x29) {
          if (ntodo < 1) goto LAB_0011dfd5;
          lVar3 = 0;
          do {
            *(bool *)((long)output + lVar3) = *(long *)((long)input + lVar3 * 8) != 0;
            lVar3 = lVar3 + 1;
          } while (ntodo != lVar3);
        }
        else if (inputType == 0x2a) {
          if (ntodo < 1) goto LAB_0011dfd5;
          lVar3 = 0;
          do {
            *(bool *)((long)output + lVar3) = *(float *)((long)input + lVar3 * 4) != 0.0;
            lVar3 = lVar3 + 1;
          } while (ntodo != lVar3);
        }
        else {
          if (inputType != 0x52) goto LAB_0011dd0d;
          if (ntodo < 1) goto LAB_0011dfd5;
          lVar3 = 0;
          do {
            *(bool *)((long)output + lVar3) = *(double *)((long)input + lVar3 * 8) != 0.0;
            lVar3 = lVar3 + 1;
          } while (ntodo != lVar3);
        }
        if (0 < ntodo) {
          lVar3 = 0;
          do {
            if (undef[lVar3] != '\0') {
              *(undefined1 *)((long)output + lVar3) = *nulval;
              *anynull = 1;
            }
            lVar3 = lVar3 + 1;
          } while (ntodo != lVar3);
        }
        goto LAB_0011dfd5;
      }
    }
    else {
      if (outputType == 0x15) {
        if (inputType < 0x29) {
          if ((inputType == 0xb) || (inputType == 0xe)) {
            if (ntodo < 1) goto LAB_0011dfd5;
            lVar3 = 0;
            do {
              *(ushort *)((long)output + lVar3 * 2) = (ushort)*(byte *)((long)input + lVar3);
              lVar3 = lVar3 + 1;
            } while (ntodo != lVar3);
          }
          else if (inputType == 0x15) {
            if (ntodo < 1) goto LAB_0011dfd5;
            lVar3 = 0;
            do {
              *(undefined2 *)((long)output + lVar3 * 2) = *(undefined2 *)((long)input + lVar3 * 2);
              lVar3 = lVar3 + 1;
            } while (ntodo != lVar3);
          }
          else {
LAB_0011dc5a:
            *status = 0x19a;
          }
        }
        else if (inputType == 0x52) {
          fffr8i2((double *)input,ntodo,1.0,0.0,0,0,(char *)0x0,(int *)0x0,(short *)output,status);
        }
        else {
          if (inputType != 0x2a) {
            if (inputType == 0x29) {
              if (0 < ntodo) {
                lVar3 = 0;
                do {
                  if (undef[lVar3] == '\0') {
                    lVar2 = *(long *)((long)input + lVar3 * 8);
                    if (lVar2 < -0x8000) {
                      *status = -0xb;
                      *(undefined2 *)((long)output + lVar3 * 2) = 0x8000;
                    }
                    else if (lVar2 < 0x8000) {
                      *(short *)((long)output + lVar3 * 2) = (short)lVar2;
                    }
                    else {
                      *status = -0xb;
                      *(undefined2 *)((long)output + lVar3 * 2) = 0x7fff;
                    }
                  }
                  else {
                    *(undefined2 *)((long)output + lVar3 * 2) = *nulval;
                    *anynull = 1;
                  }
                  lVar3 = lVar3 + 1;
                } while (ntodo != lVar3);
              }
              goto LAB_0011dfd5;
            }
            goto LAB_0011dc5a;
          }
          fffr4i2((float *)input,ntodo,1.0,0.0,0,0,(char *)0x0,(int *)0x0,(short *)output,status);
        }
        if (0 < ntodo) {
          lVar3 = 0;
          do {
            if (undef[lVar3] != '\0') {
              *(undefined2 *)((long)output + lVar3 * 2) = *nulval;
              *anynull = 1;
            }
            lVar3 = lVar3 + 1;
          } while (ntodo != lVar3);
        }
        goto LAB_0011dfd5;
      }
      if (outputType == 0x1f) {
        if (inputType < 0x29) {
          if ((inputType == 0xb) || (inputType == 0xe)) {
            if (ntodo < 1) goto LAB_0011dfd5;
            lVar3 = 0;
            do {
              *(uint *)((long)output + lVar3 * 4) = (uint)*(byte *)((long)input + lVar3);
              lVar3 = lVar3 + 1;
            } while (ntodo != lVar3);
          }
          else if (inputType == 0x15) {
            if (ntodo < 1) goto LAB_0011dfd5;
            lVar3 = 0;
            do {
              *(int *)((long)output + lVar3 * 4) = (int)*(short *)((long)input + lVar3 * 2);
              lVar3 = lVar3 + 1;
            } while (ntodo != lVar3);
          }
          else {
LAB_0011dd27:
            *status = 0x19a;
          }
        }
        else if (inputType == 0x52) {
          fffr8int((double *)input,ntodo,1.0,0.0,0,0,(char *)0x0,(int *)0x0,(int *)output,status);
        }
        else if (inputType == 0x2a) {
          fffr4int((float *)input,ntodo,1.0,0.0,0,0,(char *)0x0,(int *)0x0,(int *)output,status);
        }
        else {
          if (inputType != 0x29) goto LAB_0011dd27;
          if (ntodo < 1) goto LAB_0011dfd5;
          lVar3 = 0;
          do {
            *(undefined4 *)((long)output + lVar3 * 4) = *(undefined4 *)((long)input + lVar3 * 8);
            lVar3 = lVar3 + 1;
          } while (ntodo != lVar3);
        }
        if (0 < ntodo) {
          lVar3 = 0;
          do {
            if (undef[lVar3] != '\0') {
              *(undefined4 *)((long)output + lVar3 * 4) = *nulval;
              *anynull = 1;
            }
            lVar3 = lVar3 + 1;
          } while (ntodo != lVar3);
        }
        goto LAB_0011dfd5;
      }
    }
  }
  else if (outputType < 0x51) {
    if (outputType == 0x29) {
      if (inputType < 0x29) {
        if ((inputType == 0xb) || (inputType == 0xe)) {
          if (ntodo < 1) goto LAB_0011dfd5;
          lVar3 = 0;
          do {
            *(ulong *)((long)output + lVar3 * 8) = (ulong)*(byte *)((long)input + lVar3);
            lVar3 = lVar3 + 1;
          } while (ntodo != lVar3);
        }
        else if (inputType == 0x15) {
          if (ntodo < 1) goto LAB_0011dfd5;
          lVar3 = 0;
          do {
            *(long *)((long)output + lVar3 * 8) = (long)*(short *)((long)input + lVar3 * 2);
            lVar3 = lVar3 + 1;
          } while (ntodo != lVar3);
        }
        else {
LAB_0011dc4d:
          *status = 0x19a;
        }
      }
      else if (inputType == 0x52) {
        fffr8i4((double *)input,ntodo,1.0,0.0,0,0,(char *)0x0,(int *)0x0,(long *)output,status);
      }
      else if (inputType == 0x2a) {
        fffr4i4((float *)input,ntodo,1.0,0.0,0,0,(char *)0x0,(int *)0x0,(long *)output,status);
      }
      else {
        if (inputType != 0x29) goto LAB_0011dc4d;
        if (ntodo < 1) goto LAB_0011dfd5;
        lVar3 = 0;
        do {
          *(undefined8 *)((long)output + lVar3 * 8) = *(undefined8 *)((long)input + lVar3 * 8);
          lVar3 = lVar3 + 1;
        } while (ntodo != lVar3);
      }
      if (0 < ntodo) {
        lVar3 = 0;
        do {
          if (undef[lVar3] != '\0') {
            *(undefined8 *)((long)output + lVar3 * 8) = *nulval;
            *anynull = 1;
          }
          lVar3 = lVar3 + 1;
        } while (ntodo != lVar3);
      }
      goto LAB_0011dfd5;
    }
    if (outputType == 0x2a) {
      if (inputType < 0x29) {
        if ((inputType == 0xb) || (inputType == 0xe)) {
          if (ntodo < 1) goto LAB_0011dfd5;
          lVar3 = 0;
          do {
            *(float *)((long)output + lVar3 * 4) = (float)*(byte *)((long)input + lVar3);
            lVar3 = lVar3 + 1;
          } while (ntodo != lVar3);
        }
        else if (inputType == 0x15) {
          if (ntodo < 1) goto LAB_0011dfd5;
          lVar3 = 0;
          do {
            *(float *)((long)output + lVar3 * 4) = (float)(int)*(short *)((long)input + lVar3 * 2);
            lVar3 = lVar3 + 1;
          } while (ntodo != lVar3);
        }
        else {
LAB_0011dd1a:
          *status = 0x19a;
        }
      }
      else if (inputType == 0x29) {
        if (ntodo < 1) goto LAB_0011dfd5;
        lVar3 = 0;
        do {
          *(float *)((long)output + lVar3 * 4) = (float)*(long *)((long)input + lVar3 * 8);
          lVar3 = lVar3 + 1;
        } while (ntodo != lVar3);
      }
      else if (inputType == 0x52) {
        fffr8r4((double *)input,ntodo,1.0,0.0,0,0.0,(char *)0x0,(int *)0x0,(float *)output,status);
      }
      else {
        if (inputType != 0x2a) goto LAB_0011dd1a;
        if (ntodo < 1) goto LAB_0011dfd5;
        lVar3 = 0;
        do {
          *(undefined4 *)((long)output + lVar3 * 4) = *(undefined4 *)((long)input + lVar3 * 4);
          lVar3 = lVar3 + 1;
        } while (ntodo != lVar3);
      }
      if (0 < ntodo) {
        lVar3 = 0;
        do {
          if (undef[lVar3] != '\0') {
            *(undefined4 *)((long)output + lVar3 * 4) = *nulval;
            *anynull = 1;
          }
          lVar3 = lVar3 + 1;
        } while (ntodo != lVar3);
      }
      goto LAB_0011dfd5;
    }
  }
  else {
    if (outputType == 0x51) {
      if (inputType < 0x29) {
        if ((inputType == 0xb) || (inputType == 0xe)) {
          if (ntodo < 1) goto LAB_0011dfd5;
          lVar3 = 0;
          do {
            *(ulong *)((long)output + lVar3 * 8) = (ulong)*(byte *)((long)input + lVar3);
            lVar3 = lVar3 + 1;
          } while (ntodo != lVar3);
        }
        else if (inputType == 0x15) {
          if (ntodo < 1) goto LAB_0011dfd5;
          lVar3 = 0;
          do {
            *(long *)((long)output + lVar3 * 8) = (long)*(short *)((long)input + lVar3 * 2);
            lVar3 = lVar3 + 1;
          } while (ntodo != lVar3);
        }
        else {
LAB_0011dc67:
          *status = 0x19a;
        }
      }
      else if (inputType == 0x52) {
        fffr8i8((double *)input,ntodo,1.0,0.0,0,0,(char *)0x0,(int *)0x0,(LONGLONG *)output,status);
      }
      else if (inputType == 0x2a) {
        fffr4i8((float *)input,ntodo,1.0,0.0,0,0,(char *)0x0,(int *)0x0,(LONGLONG *)output,status);
      }
      else {
        if (inputType != 0x29) goto LAB_0011dc67;
        if (ntodo < 1) goto LAB_0011dfd5;
        lVar3 = 0;
        do {
          *(undefined8 *)((long)output + lVar3 * 8) = *(undefined8 *)((long)input + lVar3 * 8);
          lVar3 = lVar3 + 1;
        } while (ntodo != lVar3);
      }
      if (0 < ntodo) {
        lVar3 = 0;
        do {
          if (undef[lVar3] != '\0') {
            *(undefined8 *)((long)output + lVar3 * 8) = *nulval;
            *anynull = 1;
          }
          lVar3 = lVar3 + 1;
        } while (ntodo != lVar3);
      }
      goto LAB_0011dfd5;
    }
    if (outputType == 0x52) {
      if (inputType < 0x29) {
        if ((inputType == 0xb) || (inputType == 0xe)) {
          if (ntodo < 1) goto LAB_0011dfd5;
          lVar3 = 0;
          do {
            *(double *)((long)output + lVar3 * 8) = (double)*(byte *)((long)input + lVar3);
            lVar3 = lVar3 + 1;
          } while (ntodo != lVar3);
        }
        else if (inputType == 0x15) {
          if (ntodo < 1) goto LAB_0011dfd5;
          lVar3 = 0;
          do {
            *(double *)((long)output + lVar3 * 8) = (double)(int)*(short *)((long)input + lVar3 * 2)
            ;
            lVar3 = lVar3 + 1;
          } while (ntodo != lVar3);
        }
        else {
LAB_0011dd34:
          *status = 0x19a;
        }
      }
      else if (inputType == 0x29) {
        if (ntodo < 1) goto LAB_0011dfd5;
        lVar3 = 0;
        do {
          *(double *)((long)output + lVar3 * 8) = (double)*(long *)((long)input + lVar3 * 8);
          lVar3 = lVar3 + 1;
        } while (ntodo != lVar3);
      }
      else if (inputType == 0x2a) {
        if (ntodo < 1) goto LAB_0011dfd5;
        lVar3 = 0;
        do {
          *(double *)((long)output + lVar3 * 8) = (double)*(float *)((long)input + lVar3 * 4);
          lVar3 = lVar3 + 1;
        } while (ntodo != lVar3);
      }
      else {
        if (inputType != 0x52) goto LAB_0011dd34;
        if (ntodo < 1) goto LAB_0011dfd5;
        lVar3 = 0;
        do {
          *(undefined8 *)((long)output + lVar3 * 8) = *(undefined8 *)((long)input + lVar3 * 8);
          lVar3 = lVar3 + 1;
        } while (ntodo != lVar3);
      }
      if (0 < ntodo) {
        lVar3 = 0;
        do {
          if (undef[lVar3] != '\0') {
            *(undefined8 *)((long)output + lVar3 * 8) = *nulval;
            *anynull = 1;
          }
          lVar3 = lVar3 + 1;
        } while (ntodo != lVar3);
      }
      goto LAB_0011dfd5;
    }
  }
  *status = 0x19a;
LAB_0011dfd5:
  return *status;
}

Assistant:

int ffcvtn( int   inputType,  /* I - Data type of input array               */
            void  *input,     /* I - Input array of type inputType          */
            char  *undef,     /* I - Array of flags indicating UNDEF elems  */
            long  ntodo,      /* I - Number of elements to process          */
            int   outputType, /* I - Data type of output array              */
            void  *nulval,    /* I - Ptr to value to use for UNDEF elements */
            void  *output,    /* O - Output array of type outputType        */
            int   *anynull,   /* O - Any nulls flagged?                     */
            int   *status )   /* O - Error status                           */
/*                                                                          */
/* Convert an array of any input data type to an array of any output        */
/* data type, using an array of UNDEF flags to assign nulvals to            */
/*--------------------------------------------------------------------------*/
{
   long i;

   switch( outputType ) {

   case TLOGICAL:
      switch( inputType ) {
      case TLOGICAL:
      case TBYTE:
         for( i=0; i<ntodo; i++ )
            if( ((unsigned char*)input)[i] )
                ((unsigned char*)output)[i] = 1;
            else
                ((unsigned char*)output)[i] = 0;
         break;
      case TSHORT:
         for( i=0; i<ntodo; i++ )
            if( ((short*)input)[i] )
                ((unsigned char*)output)[i] = 1;
            else
                ((unsigned char*)output)[i] = 0;
         break;
      case TLONG:
         for( i=0; i<ntodo; i++ )
            if( ((long*)input)[i] )
                ((unsigned char*)output)[i] = 1;
            else
                ((unsigned char*)output)[i] = 0;
         break;
      case TFLOAT:
         for( i=0; i<ntodo; i++ )
            if( ((float*)input)[i] )
                ((unsigned char*)output)[i] = 1;
            else
                ((unsigned char*)output)[i] = 0;
         break;
      case TDOUBLE:
         for( i=0; i<ntodo; i++ )
            if( ((double*)input)[i] )
                ((unsigned char*)output)[i] = 1;
            else
                ((unsigned char*)output)[i] = 0;
         break;
      default:
         *status = BAD_DATATYPE;
         break;
      }
      for(i=0;i<ntodo;i++) {
         if( undef[i] ) {
            ((unsigned char*)output)[i] = *(unsigned char*)nulval;
            *anynull = 1;
         }
      }
      break;

   case TBYTE:
      switch( inputType ) {
      case TLOGICAL:
      case TBYTE:
         for( i=0; i<ntodo; i++ )
            ((unsigned char*)output)[i] = ((unsigned char*)input)[i];
         break;
      case TSHORT:
         fffi2i1((short*)input,ntodo,1.,0.,0,0,0,NULL,NULL,(unsigned char*)output,status);
         break;
      case TLONG:
         for (i = 0; i < ntodo; i++) {
            if( undef[i] ) {
               ((unsigned char*)output)[i] = *(unsigned char*)nulval;
               *anynull = 1;
            } else {
               if( ((long*)input)[i] < 0 ) {
                  *status = OVERFLOW_ERR;
                  ((unsigned char*)output)[i] = 0;
               } else if( ((long*)input)[i] > UCHAR_MAX ) {
                  *status = OVERFLOW_ERR;
                  ((unsigned char*)output)[i] = UCHAR_MAX;
               } else
                  ((unsigned char*)output)[i] = 
                     (unsigned char) ((long*)input)[i];
            }
         }
         return( *status );
      case TFLOAT:
         fffr4i1((float*)input,ntodo,1.,0.,0,0,NULL,NULL,
                 (unsigned char*)output,status);
         break;
      case TDOUBLE:
         fffr8i1((double*)input,ntodo,1.,0.,0,0,NULL,NULL,
                 (unsigned char*)output,status);
         break;
      default:
         *status = BAD_DATATYPE;
         break;
      }
      for(i=0;i<ntodo;i++) {
         if( undef[i] ) {
            ((unsigned char*)output)[i] = *(unsigned char*)nulval;
            *anynull = 1;
         }
      }
      break;

   case TSHORT:
      switch( inputType ) {
      case TLOGICAL:
      case TBYTE:
         for( i=0; i<ntodo; i++ )
            ((short*)output)[i] = ((unsigned char*)input)[i];
         break;
      case TSHORT:
         for( i=0; i<ntodo; i++ )
            ((short*)output)[i] = ((short*)input)[i];
         break;
      case TLONG:
         for (i = 0; i < ntodo; i++) {
            if( undef[i] ) {
               ((short*)output)[i] = *(short*)nulval;
               *anynull = 1;
            } else {
               if( ((long*)input)[i] < SHRT_MIN ) {
                  *status = OVERFLOW_ERR;
                  ((short*)output)[i] = SHRT_MIN;
               } else if ( ((long*)input)[i] > SHRT_MAX ) {
                  *status = OVERFLOW_ERR;
                  ((short*)output)[i] = SHRT_MAX;
               } else
                  ((short*)output)[i] = (short) ((long*)input)[i];
            }
         }
         return( *status );
      case TFLOAT:
         fffr4i2((float*)input,ntodo,1.,0.,0,0,NULL,NULL,
                 (short*)output,status);
         break;
      case TDOUBLE:
         fffr8i2((double*)input,ntodo,1.,0.,0,0,NULL,NULL,
                 (short*)output,status);
         break;
      default:
         *status = BAD_DATATYPE;
         break;
      }
      for(i=0;i<ntodo;i++) {
         if( undef[i] ) {
            ((short*)output)[i] = *(short*)nulval;
            *anynull = 1;
         }
      }
      break;

   case TINT:
      switch( inputType ) {
      case TLOGICAL:
      case TBYTE:
         for( i=0; i<ntodo; i++ )
            ((int*)output)[i] = ((unsigned char*)input)[i];
         break;
      case TSHORT:
         for( i=0; i<ntodo; i++ )
            ((int*)output)[i] = ((short*)input)[i];
         break;
      case TLONG:
         for( i=0; i<ntodo; i++ )
            ((int*)output)[i] = ((long*)input)[i];
         break;
      case TFLOAT:
         fffr4int((float*)input,ntodo,1.,0.,0,0,NULL,NULL,
                  (int*)output,status);
         break;
      case TDOUBLE:
         fffr8int((double*)input,ntodo,1.,0.,0,0,NULL,NULL,
                  (int*)output,status);
         break;
      default:
         *status = BAD_DATATYPE;
         break;
      }
      for(i=0;i<ntodo;i++) {
         if( undef[i] ) {
            ((int*)output)[i] = *(int*)nulval;
            *anynull = 1;
         }
      }
      break;

   case TLONG:
      switch( inputType ) {
      case TLOGICAL:
      case TBYTE:
         for( i=0; i<ntodo; i++ )
            ((long*)output)[i] = ((unsigned char*)input)[i];
         break;
      case TSHORT:
         for( i=0; i<ntodo; i++ )
            ((long*)output)[i] = ((short*)input)[i];
         break;
      case TLONG:
         for( i=0; i<ntodo; i++ )
            ((long*)output)[i] = ((long*)input)[i];
         break;
      case TFLOAT:
         fffr4i4((float*)input,ntodo,1.,0.,0,0,NULL,NULL,
                 (long*)output,status);
         break;
      case TDOUBLE:
         fffr8i4((double*)input,ntodo,1.,0.,0,0,NULL,NULL,
                 (long*)output,status);
         break;
      default:
         *status = BAD_DATATYPE;
         break;
      }
      for(i=0;i<ntodo;i++) {
         if( undef[i] ) {
            ((long*)output)[i] = *(long*)nulval;
            *anynull = 1;
         }
      }
      break;

   case TLONGLONG:
      switch( inputType ) {
      case TLOGICAL:
      case TBYTE:
         for( i=0; i<ntodo; i++ )
            ((LONGLONG*)output)[i] = ((unsigned char*)input)[i];
         break;
      case TSHORT:
         for( i=0; i<ntodo; i++ )
            ((LONGLONG*)output)[i] = ((short*)input)[i];
         break;
      case TLONG:
         for( i=0; i<ntodo; i++ )
            ((LONGLONG*)output)[i] = ((long*)input)[i];
         break;
      case TFLOAT:
         fffr4i8((float*)input,ntodo,1.,0.,0,0,NULL,NULL,
                 (LONGLONG*)output,status);
         break;
      case TDOUBLE:
         fffr8i8((double*)input,ntodo,1.,0.,0,0,NULL,NULL,
                 (LONGLONG*)output,status);

         break;
      default:
         *status = BAD_DATATYPE;
         break;
      }
      for(i=0;i<ntodo;i++) {
         if( undef[i] ) {
            ((LONGLONG*)output)[i] = *(LONGLONG*)nulval;
            *anynull = 1;
         }
      }
      break;

   case TFLOAT:
      switch( inputType ) {
      case TLOGICAL:
      case TBYTE:
         for( i=0; i<ntodo; i++ )
            ((float*)output)[i] = ((unsigned char*)input)[i];
         break;
      case TSHORT:
         for( i=0; i<ntodo; i++ )
            ((float*)output)[i] = ((short*)input)[i];
         break;
      case TLONG:
         for( i=0; i<ntodo; i++ )
            ((float*)output)[i] = (float) ((long*)input)[i];
         break;
      case TFLOAT:
         for( i=0; i<ntodo; i++ )
            ((float*)output)[i] = ((float*)input)[i];
         break;
      case TDOUBLE:
         fffr8r4((double*)input,ntodo,1.,0.,0,0,NULL,NULL,
                 (float*)output,status);
         break;
      default:
         *status = BAD_DATATYPE;
         break;
      }
      for(i=0;i<ntodo;i++) {
         if( undef[i] ) {
            ((float*)output)[i] = *(float*)nulval;
            *anynull = 1;
         }
      }
      break;

   case TDOUBLE:
      switch( inputType ) {
      case TLOGICAL:
      case TBYTE:
         for( i=0; i<ntodo; i++ )
            ((double*)output)[i] = ((unsigned char*)input)[i];
         break;
      case TSHORT:
         for( i=0; i<ntodo; i++ )
            ((double*)output)[i] = ((short*)input)[i];
         break;
      case TLONG:
         for( i=0; i<ntodo; i++ )
            ((double*)output)[i] = ((long*)input)[i];
         break;
      case TFLOAT:
         for( i=0; i<ntodo; i++ )
            ((double*)output)[i] = ((float*)input)[i];
         break;
      case TDOUBLE:
         for( i=0; i<ntodo; i++ )
            ((double*)output)[i] = ((double*)input)[i];
         break;
      default:
         *status = BAD_DATATYPE;
         break;
      }
      for(i=0;i<ntodo;i++) {
         if( undef[i] ) {
            ((double*)output)[i] = *(double*)nulval;
            *anynull = 1;
         }
      }
      break;

   default:
      *status = BAD_DATATYPE;
      break;
   }

   return ( *status );
}